

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfcc.hpp
# Opt level: O0

Mat_<double> *
pcen(Mat_<double> *__return_storage_ptr__,
    vector<unsigned_char,_std::allocator<unsigned_char>_> *ifile_data,int nSamples_per_sec)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  size_type sVar4;
  float *_data;
  element_type *peVar5;
  double *data_in;
  double *data_out;
  __type _Var6;
  double dVar7;
  _OutputArray local_17b0;
  _InputArray local_1798;
  undefined1 local_1779;
  Scalar_<double> local_1778;
  Mat local_1758 [352];
  MatExpr local_15f8 [352];
  undefined1 local_1498 [8];
  Mat_<double> S_out;
  Mat local_1420 [352];
  _InputArray local_12c0;
  _OutputArray local_12a8;
  Scalar_<double> local_1290;
  _InputArray local_1270;
  _InputArray local_1258 [14];
  MatExpr local_10f8 [352];
  MatExpr local_f98 [352];
  _InputArray local_e38;
  undefined1 local_e20 [8];
  Mat_<double> smooth_log1p_exp;
  Mat_<double> smooth_log1p;
  Scalar_<double> local_d48;
  Mat local_d28 [352];
  MatExpr local_bc8 [352];
  _InputArray local_a68;
  undefined1 local_a50 [8];
  Mat_<double> smooth;
  Scalar_<double> local_9d8;
  Mat local_9b8 [352];
  MatExpr local_858 [352];
  _InputArray local_6f8;
  undefined1 local_6e0 [8];
  Mat_<double> S_smooth_log1p;
  double eps;
  double power;
  double bias;
  double gain;
  undefined1 local_658 [4];
  int i;
  Mat_<double> S_smooth;
  double iir_a [2];
  double iir_b [1];
  Mat local_5d0 [352];
  undefined1 local_470 [8];
  Mat_<double> mel;
  cv local_3b0 [352];
  MatExpr local_250 [368];
  undefined1 local_e0 [8];
  Mat_<double> mag;
  Mat_<float> cv_emphasis_data;
  int ifile_length;
  int nSamples_per_sec_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ifile_data_local;
  Mat_<double> *pcen;
  
  if ((ifile_data == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) ||
     (bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(ifile_data), bVar1))
  {
    poVar3 = std::operator<<((ostream *)&std::cout,"error: invalid paramter: ifile_data");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    cv::Mat_<double>::Mat_(__return_storage_ptr__,0,0);
  }
  else if (nSamples_per_sec == nSamplesPerSec) {
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(ifile_data);
    _data = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(ifile_data);
    cv::Mat_<float>::Mat_((Mat_<float> *)&mag.field_0x58,1,(int)(sVar4 >> 2),_data,0);
    MagnitudeSpectrogram
              ((Mat_<double> *)local_e0,(Mat_<float> *)&mag.field_0x58,length_DFT,hop_length,
               win_length);
    cv::abs<double>(local_3b0,(Mat_<double> *)local_e0);
    _Var6 = std::pow<int,int>(2,0x1f);
    cv::operator*(local_250,_Var6);
    cv::Mat_<double>::operator=((Mat_<double> *)local_e0,local_250);
    cv::MatExpr::~MatExpr(local_250);
    cv::MatExpr::~MatExpr((MatExpr *)local_3b0);
    bVar2 = cv::Mat::empty();
    if ((bVar2 & 1) != 0) {
      mel_spectrogram_create
                ((Mat_<double> *)&mel.field_0x58,nSamplesPerSec,length_DFT,number_filterbanks);
      cv::Mat_<double>::operator=(&mel_basis,(Mat_<double> *)&mel.field_0x58);
      cv::Mat_<double>::~Mat_((Mat_<double> *)&mel.field_0x58);
    }
    cv::operator*(local_5d0,&mel_basis.super_Mat);
    cv::Mat_<double>::Mat_((Mat_<double> *)local_470,(MatExpr *)local_5d0);
    cv::MatExpr::~MatExpr((MatExpr *)local_5d0);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&filter);
    if (!bVar1) {
      std::make_shared<IIR_I>();
      std::shared_ptr<IIR_I>::operator=(&filter,(shared_ptr<IIR_I> *)iir_b);
      std::shared_ptr<IIR_I>::~shared_ptr((shared_ptr<IIR_I> *)iir_b);
      iir_a[1] = 0.05638943879134889;
      S_smooth._88_8_ = 0x3ff0000000000000;
      iir_a[0] = -0.9436105612086512;
      peVar5 = std::__shared_ptr_access<IIR_I,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<IIR_I,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &filter);
      IIR_I::setPara(peVar5,iir_a + 1,1,(double *)&S_smooth.field_0x58,2);
    }
    cv::Mat_<double>::Mat_((Mat_<double> *)local_658,mel._0_4_,mel._4_4_);
    for (gain._4_4_ = 0; gain._4_4_ < (int)mel._0_4_; gain._4_4_ = gain._4_4_ + 1) {
      peVar5 = std::__shared_ptr_access<IIR_I,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<IIR_I,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &filter);
      data_in = cv::Mat_<double>::operator[]((Mat_<double> *)local_470,gain._4_4_);
      data_out = cv::Mat_<double>::operator[]((Mat_<double> *)local_658,gain._4_4_);
      IIR_I::filter(peVar5,data_in,data_out,mel._4_4_);
    }
    S_smooth_log1p._88_8_ = 0x3eb0c6f7a0b5ed8d;
    cv::Mat_<double>::Mat_((Mat_<double> *)local_6e0);
    cv::operator/(local_9b8,(double)S_smooth_log1p._88_8_);
    cv::Scalar_<double>::Scalar_(&local_9d8,1.0);
    cv::operator+(local_858,(Scalar_ *)local_9b8);
    cv::_InputArray::_InputArray(&local_6f8,local_858);
    cv::_OutputArray::_OutputArray<double>
              ((_OutputArray *)&smooth.field_0x58,(Mat_<double> *)local_6e0);
    cv::log(&local_6f8,(_OutputArray *)&smooth.field_0x58);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&smooth.field_0x58);
    cv::_InputArray::~_InputArray(&local_6f8);
    cv::MatExpr::~MatExpr(local_858);
    cv::MatExpr::~MatExpr((MatExpr *)local_9b8);
    cv::Mat_<double>::Mat_((Mat_<double> *)local_a50);
    dVar7 = log((double)S_smooth_log1p._88_8_);
    cv::Scalar_<double>::Scalar_(&local_d48,dVar7);
    cv::operator+(local_d28,(Scalar_ *)local_6e0);
    cv::operator*(local_bc8,-0.98);
    cv::_InputArray::_InputArray(&local_a68,local_bc8);
    cv::_OutputArray::_OutputArray<double>
              ((_OutputArray *)&smooth_log1p.field_0x58,(Mat_<double> *)local_a50);
    cv::exp(&local_a68,(_OutputArray *)&smooth_log1p.field_0x58);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&smooth_log1p.field_0x58);
    cv::_InputArray::~_InputArray(&local_a68);
    cv::MatExpr::~MatExpr(local_bc8);
    cv::MatExpr::~MatExpr((MatExpr *)local_d28);
    cv::Mat_<double>::Mat_((Mat_<double> *)&smooth_log1p_exp.field_0x58);
    cv::Mat_<double>::Mat_((Mat_<double> *)local_e20);
    cv::_InputArray::_InputArray<double>(&local_1270,(Mat_<double> *)local_a50);
    cv::Mat::mul(local_1258,1.0);
    cv::operator/(local_10f8,2.0);
    cv::Scalar_<double>::Scalar_(&local_1290,1.0);
    cv::operator+(local_f98,(Scalar_ *)local_10f8);
    cv::_InputArray::_InputArray(&local_e38,local_f98);
    cv::_OutputArray::_OutputArray<double>(&local_12a8,(Mat_<double> *)&smooth_log1p_exp.field_0x58)
    ;
    cv::log(&local_e38,&local_12a8);
    cv::_OutputArray::~_OutputArray(&local_12a8);
    cv::_InputArray::~_InputArray(&local_e38);
    cv::MatExpr::~MatExpr(local_f98);
    cv::MatExpr::~MatExpr(local_10f8);
    cv::MatExpr::~MatExpr((MatExpr *)local_1258);
    cv::_InputArray::~_InputArray(&local_1270);
    cv::operator*(0.5,local_1420);
    cv::_InputArray::_InputArray(&local_12c0,(MatExpr *)local_1420);
    cv::_OutputArray::_OutputArray<double>
              ((_OutputArray *)&S_out.field_0x58,(Mat_<double> *)local_e20);
    cv::exp(&local_12c0,(_OutputArray *)&S_out.field_0x58);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&S_out.field_0x58);
    cv::_InputArray::~_InputArray(&local_12c0);
    cv::MatExpr::~MatExpr((MatExpr *)local_1420);
    cv::Scalar_<double>::Scalar_(&local_1778,1.0);
    cv::operator-(local_1758,(Scalar_ *)local_e20);
    dVar7 = pow(2.0,0.5);
    cv::operator*(local_15f8,dVar7);
    cv::Mat_<double>::Mat_((Mat_<double> *)local_1498,local_15f8);
    cv::MatExpr::~MatExpr(local_15f8);
    cv::MatExpr::~MatExpr((MatExpr *)local_1758);
    local_1779 = 0;
    cv::Mat_<double>::Mat_(__return_storage_ptr__);
    cv::_InputArray::_InputArray<double>(&local_1798,(Mat_<double> *)local_1498);
    cv::_OutputArray::_OutputArray<double>(&local_17b0,__return_storage_ptr__);
    cv::transpose(&local_1798,&local_17b0);
    cv::_OutputArray::~_OutputArray(&local_17b0);
    cv::_InputArray::~_InputArray(&local_1798);
    local_1779 = 1;
    cv::Mat_<double>::~Mat_((Mat_<double> *)local_1498);
    cv::Mat_<double>::~Mat_((Mat_<double> *)local_e20);
    cv::Mat_<double>::~Mat_((Mat_<double> *)&smooth_log1p_exp.field_0x58);
    cv::Mat_<double>::~Mat_((Mat_<double> *)local_a50);
    cv::Mat_<double>::~Mat_((Mat_<double> *)local_6e0);
    cv::Mat_<double>::~Mat_((Mat_<double> *)local_658);
    cv::Mat_<double>::~Mat_((Mat_<double> *)local_470);
    cv::Mat_<double>::~Mat_((Mat_<double> *)local_e0);
    cv::Mat_<float>::~Mat_((Mat_<float> *)&mag.field_0x58);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"error: the \"nSamples_per_sec\" is not 16000.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    cv::Mat_<double>::Mat_(__return_storage_ptr__,0,0);
  }
  return __return_storage_ptr__;
}

Assistant:

cv::Mat_<double> pcen(std::vector<uint8_t> &ifile_data, int nSamples_per_sec) {
    if (!(&ifile_data) || ifile_data.empty()) {
        std::cout << "error: invalid paramter: ifile_data" << std::endl;
        return cv::Mat_<double>(0, 0);
    }
    if (nSamples_per_sec != nSamplesPerSec) {
        std::cout << R"(error: the "nSamples_per_sec" is not 16000.)" << std::endl;
        return cv::Mat_<double>(0, 0);
    }
    int ifile_length = int(ifile_data.size() / 4);
    cv::Mat_<float> cv_emphasis_data(1, ifile_length, (float *) (ifile_data.data()));

    // magnitude spectrogram 幅度谱图
    auto mag = MagnitudeSpectrogram(&cv_emphasis_data, length_DFT, hop_length, win_length);
    mag = cv::abs(mag) * std::pow(2, 31);

    // 生成梅尔谱图 mel spectrogram       //3ms
    if (mel_basis.empty()) {
        mel_basis = mel_spectrogram_create(nSamplesPerSec, length_DFT, number_filterbanks);
    }

    // doc
    cv::Mat_<double> mel = mel_basis * mag;

    // 计算pcen特征
//    double time_constant = 0.400;
//    int sr = 22050;
//    int hop_length = 512;
//    double t_frames = time_constant * sr / double(hop_length);
//    double b = (sqrt(1 + 4 * t_frames * t_frames) - 1) / (2 * t_frames * t_frames);
//    cv::Mat_<double> zi = (cv::Mat_<double>(1, 1) << 0.94361056);
//
//    cv::Mat_<double> in_b = (cv::Mat_<double>(1, 1) << b);
//    cv::Mat_<double> in_a = (cv::Mat_<double>(1, 2) << 1, b - 1);
//    cv::Mat_<double> zi = cvlfilter_zi(in_b, in_a);
    // 第二个公式计算
//    cv::Mat_<double> S_smooth = cvlfilter(in_b, in_a, mel, zi);

#if 1 // IIR滤波器
    if (!filter) {
        filter = std::make_shared<IIR_I>();
        double iir_b[1] = {0.05638943879134889};
        double iir_a[2] = {1.0, -0.9436105612086512};
        //filter.reset();
        filter->setPara(iir_b, 1, iir_a, 2);
    }
    cv::Mat_<double> S_smooth = cv::Mat_<double>(mel.rows, mel.cols);
    for (int i = 0; i < mel.rows; i++) {
        filter->filter(mel[i], S_smooth[i], mel.cols);
    }

#endif

    // 第一个公式计算
    double gain = 0.98;
    double bias = 2.0;
    double power = 0.5;
    double eps = 1e-6;
    //python: smooth = np.exp(-gain * (np.log(eps) + np.log1p(S_smooth / eps)))
    cv::Mat_<double> S_smooth_log1p;
    cv::log(S_smooth / eps + 1, S_smooth_log1p);
    cv::Mat_<double> smooth;
    cv::exp((S_smooth_log1p + cv::log(eps)) * (-gain), smooth);
    //python: S_out = (bias ** power) * np.expm1(power * np.log1p(ref * smooth / bias))
    cv::Mat_<double> smooth_log1p;
    cv::Mat_<double> smooth_log1p_exp;
    cv::log(mel.mul(smooth) / bias + 1, smooth_log1p);
    cv::exp(power * smooth_log1p, smooth_log1p_exp);
    cv::Mat_<double> S_out = (smooth_log1p_exp - 1) * pow(bias, power);
    // transpose
    cv::Mat_<double> pcen;
    cv::transpose(S_out, pcen);

    return pcen;
}